

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_linecurve.cpp
# Opt level: O2

bool __thiscall ON_LineCurve::SwapCoordinates(ON_LineCurve *this,int i,int j)

{
  ON_Line *this_00;
  double dVar1;
  double dVar2;
  double *pdVar3;
  ON_3dPoint *this_01;
  
  if (i != j && ((uint)j < 3 && (uint)i < 3)) {
    this_00 = &this->m_line;
    pdVar3 = ON_3dPoint::operator[](&this_00->from,i);
    dVar1 = *pdVar3;
    pdVar3 = ON_3dPoint::operator[](&this_00->from,j);
    dVar2 = *pdVar3;
    pdVar3 = ON_3dPoint::operator[](&this_00->from,i);
    *pdVar3 = dVar2;
    pdVar3 = ON_3dPoint::operator[](&this_00->from,j);
    *pdVar3 = dVar1;
    this_01 = &(this->m_line).to;
    pdVar3 = ON_3dPoint::operator[](this_01,i);
    dVar1 = *pdVar3;
    pdVar3 = ON_3dPoint::operator[](this_01,j);
    dVar2 = *pdVar3;
    pdVar3 = ON_3dPoint::operator[](this_01,i);
    *pdVar3 = dVar2;
    pdVar3 = ON_3dPoint::operator[](this_01,j);
    *pdVar3 = dVar1;
  }
  return i != j && ((uint)j < 3 && (uint)i < 3);
}

Assistant:

bool
ON_LineCurve::SwapCoordinates( int i, int j )
{
  bool rc = false;
  if ( i >= 0 && i < 3 && j >= 0 && j < 3 && i != j ) {
    double t = m_line.from[i];
    m_line.from[i] = m_line.from[j];
    m_line.from[j] = t;
    t = m_line.to[i];
    m_line.to[i] = m_line.to[j];
    m_line.to[j] = t;
    rc = true;
  }
  return rc;
}